

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O1

void __thiscall
JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::EnsureArray
          (GrowingArray<unsigned_int,_Memory::HeapAllocator> *this)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  HeapAllocator *pHVar6;
  undefined4 *puVar7;
  uint *dst;
  Type puVar8;
  ulong dstCount;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (this->buffer == (Type)0x0) {
    data.plusSize = (size_t)this->length;
    local_50 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_26a1866;
    data.filename._0_4_ = 0x62;
    pHVar6 = Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_50);
    uVar1 = this->length;
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_0069ade8;
      *puVar7 = 0;
    }
    puVar8 = (Type)Memory::HeapAllocator::AllocT<false>(pHVar6,(ulong)uVar1 << 2);
    if (puVar8 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_0069ade8:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    this->buffer = puVar8;
    this->count = 0;
  }
  else {
    uVar1 = this->length;
    if (this->count == uVar1) {
      if (0x7ffffffe < uVar1) {
LAB_0069adea:
        Math::DefaultOverflowPolicy();
      }
      uVar1 = uVar1 * 2 + 2;
      dstCount = (ulong)uVar1;
      local_50 = (undefined1  [8])&unsigned_int::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_26a1866;
      data.filename._0_4_ = 0x6b;
      data.plusSize = dstCount;
      pHVar6 = Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_50);
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_0069ade8;
        *puVar7 = 0;
      }
      dst = (uint *)Memory::HeapAllocator::AllocT<false>(pHVar6,dstCount * 4);
      if (dst == (uint *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_0069ade8;
        *puVar7 = 0;
      }
      Memory::CopyArray<unsigned_int,unsigned_int,Memory::HeapAllocator>
                (dst,dstCount,this->buffer,(ulong)this->length);
      uVar2 = this->length;
      if ((ulong)uVar2 != 0) {
        if (0x3fffffff < uVar2) goto LAB_0069adea;
        Memory::HeapAllocator::Free(this->alloc,this->buffer,(ulong)uVar2 << 2);
      }
      this->length = uVar1;
      this->buffer = dst;
    }
  }
  return;
}

Assistant:

void EnsureArray()
        {
            if (buffer == nullptr)
            {
                buffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, length),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    length);
                count = 0;
            }
            else if (count == length)
            {
                uint32 newLength = UInt32Math::AddMul<1, 2>(length);
                TValue * newbuffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, newLength),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    newLength);
                CopyArray<TValue, TValue, TAllocator>(newbuffer, newLength, buffer, length);
#ifdef DIAG_MEM
                listFreeAmount += length;
#endif
                if (length != 0)
                {
                    const size_t lengthByteSize = UInt32Math::Mul(length, sizeof(TValue));
                    AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, lengthByteSize);
                }
                length = newLength;
                buffer = newbuffer;
            }
        }